

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_refining_search_8p_c
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,FULLPEL_MV *best_mv)

{
  MV_COST_PARAMS *pMVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  short *in_RDX;
  undefined4 in_ESI;
  MV_COST_PARAMS *in_RDI;
  uint sad;
  FULLPEL_MV mv;
  int j;
  int best_site;
  int i;
  uint best_sad;
  int ref_stride;
  buf_2d *ref;
  buf_2d *src;
  MSBuffers *ms_buffers;
  FullMvLimits *mv_limits;
  MV_COST_PARAMS *mv_cost_params;
  int grid_coord;
  int grid_center;
  uint8_t do_refine_search_grid [49];
  MV_COST_PARAMS *in_stack_ffffffffffffff38;
  MV_COST_PARAMS *mv_cost_params_00;
  buf_2d *in_stack_ffffffffffffff40;
  buf_2d *src_00;
  FULLPEL_MV local_a0;
  int local_9c;
  int local_98;
  int local_94;
  uint local_90;
  int ref_stride_00;
  int *ref_address;
  buf_2d *src_01;
  FULLPEL_MOTION_SEARCH_PARAMS *ms_params_00;
  int local_5c;
  char local_58 [24];
  undefined1 uStack_40;
  short *local_18;
  MV_COST_PARAMS *local_10;
  undefined4 local_4;
  
  local_18 = in_RDX;
  local_10 = in_RDI;
  local_4 = in_ESI;
  memset(local_58,0,0x31);
  local_5c = 0x18;
  pMVar1 = local_10 + 1;
  ms_params_00 = (FULLPEL_MOTION_SEARCH_PARAMS *)&local_10->mvjcost;
  src_00 = (buf_2d *)local_10->mvcost[0];
  ref_address = *(int **)ms_params_00;
  ref_stride_00 = ref_address[6];
  *(undefined4 *)local_18 = local_4;
  clamp_fullmv((FULLPEL_MV *)in_stack_ffffffffffffff40,(FullMvLimits *)in_stack_ffffffffffffff38);
  get_buf_from_fullmv(in_stack_ffffffffffffff40,(FULLPEL_MV *)in_stack_ffffffffffffff38);
  iVar2 = get_mvpred_compound_sad(ms_params_00,src_00,(uint8_t *)ref_address,ref_stride_00);
  iVar3 = mvsad_err_cost_((FULLPEL_MV *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_90 = iVar3 + iVar2;
  uStack_40 = 1;
  local_94 = 0;
  while( true ) {
    if (2 < local_94) {
      return local_90;
    }
    local_98 = -1;
    for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
      iVar2 = local_5c + av1_refining_search_8p_c::neighbors[local_9c].coord_offset;
      src_01 = src_00;
      if (local_58[iVar2] != '\x01') {
        local_a0.col = local_18[1] + av1_refining_search_8p_c::neighbors[local_9c].coord.col;
        local_a0.row = *local_18 + av1_refining_search_8p_c::neighbors[local_9c].coord.row;
        local_58[iVar2] = '\x01';
        iVar2 = av1_is_fullmv_in_range((FullMvLimits *)&pMVar1->error_per_bit,local_a0);
        src_01 = src_00;
        if (iVar2 != 0) {
          mv_cost_params_00 = local_10;
          get_buf_from_fullmv(src_00,(FULLPEL_MV *)local_10);
          uVar4 = get_mvpred_compound_sad(ms_params_00,src_01,(uint8_t *)ref_address,ref_stride_00);
          if (uVar4 < local_90) {
            iVar2 = mvsad_err_cost_((FULLPEL_MV *)src_00,mv_cost_params_00);
            if (iVar2 + uVar4 < local_90) {
              local_98 = local_9c;
              local_90 = iVar2 + uVar4;
            }
          }
        }
      }
      src_00 = src_01;
    }
    if (local_98 == -1) break;
    *local_18 = *local_18 + av1_refining_search_8p_c::neighbors[local_98].coord.row;
    local_18[1] = local_18[1] + av1_refining_search_8p_c::neighbors[local_98].coord.col;
    local_5c = av1_refining_search_8p_c::neighbors[local_98].coord_offset + local_5c;
    local_94 = local_94 + 1;
  }
  return local_90;
}

Assistant:

int av1_refining_search_8p_c(const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                             const FULLPEL_MV start_mv, FULLPEL_MV *best_mv) {
  static const search_neighbors neighbors[8] = {
    { { -1, 0 }, -1 * SEARCH_GRID_STRIDE_8P + 0 },
    { { 0, -1 }, 0 * SEARCH_GRID_STRIDE_8P - 1 },
    { { 0, 1 }, 0 * SEARCH_GRID_STRIDE_8P + 1 },
    { { 1, 0 }, 1 * SEARCH_GRID_STRIDE_8P + 0 },
    { { -1, -1 }, -1 * SEARCH_GRID_STRIDE_8P - 1 },
    { { 1, -1 }, 1 * SEARCH_GRID_STRIDE_8P - 1 },
    { { -1, 1 }, -1 * SEARCH_GRID_STRIDE_8P + 1 },
    { { 1, 1 }, 1 * SEARCH_GRID_STRIDE_8P + 1 }
  };

  uint8_t do_refine_search_grid[SEARCH_GRID_STRIDE_8P *
                                SEARCH_GRID_STRIDE_8P] = { 0 };
  int grid_center = SEARCH_GRID_CENTER_8P;
  int grid_coord = grid_center;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const struct buf_2d *src = ms_buffers->src;
  const struct buf_2d *ref = ms_buffers->ref;
  const int ref_stride = ref->stride;

  *best_mv = start_mv;
  clamp_fullmv(best_mv, mv_limits);

  unsigned int best_sad = get_mvpred_compound_sad(
      ms_params, src, get_buf_from_fullmv(ref, best_mv), ref_stride);
  best_sad += mvsad_err_cost_(best_mv, mv_cost_params);

  do_refine_search_grid[grid_coord] = 1;

  for (int i = 0; i < SEARCH_RANGE_8P; ++i) {
    int best_site = -1;

    for (int j = 0; j < 8; ++j) {
      grid_coord = grid_center + neighbors[j].coord_offset;
      if (do_refine_search_grid[grid_coord] == 1) {
        continue;
      }
      const FULLPEL_MV mv = { best_mv->row + neighbors[j].coord.row,
                              best_mv->col + neighbors[j].coord.col };

      do_refine_search_grid[grid_coord] = 1;
      if (av1_is_fullmv_in_range(mv_limits, mv)) {
        unsigned int sad;
        sad = get_mvpred_compound_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = j;
          }
        }
      }
    }

    if (best_site == -1) {
      break;
    } else {
      best_mv->row += neighbors[best_site].coord.row;
      best_mv->col += neighbors[best_site].coord.col;
      grid_center += neighbors[best_site].coord_offset;
    }
  }
  return best_sad;
}